

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

int CVmObjDate::parse_date_string
              (int32_t *dayno,int32_t *daytime,char *str,vm_val_t *custom,CVmDateLocale *lc,
              multicaldate_t *cal,int32_t refday,int32_t reftime,CVmTimeZone *reftz,
              date_parse_result *resultp,date_parse_string *fmtlist,int *nfmtlist)

{
  date_parse_result *__dest;
  char *pcVar1;
  int32_t *daytime_00;
  vm_val_t *custom_00;
  int iVar2;
  int32_t iVar3;
  char *pcVar4;
  void *pvVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  char *pcVar11;
  char *curstr;
  size_t curlen;
  size_t filterlen;
  format_iter fi;
  uint local_434;
  long local_430;
  char *local_428;
  int local_420;
  int local_41c;
  CVmTimeZone *local_418;
  undefined4 local_40c;
  int32_t *local_408;
  multicaldate_t *local_400;
  char *local_3f8;
  int32_t *local_3f0;
  vm_val_t *local_3e8;
  multicaldate_t *local_3e0;
  char *local_3d8;
  date_parse_string *local_3d0;
  CVmDateLocale *local_3c8;
  char *local_3c0;
  ulong local_3b8;
  size_t local_3b0 [8];
  date_parse_result local_370;
  format_iter local_258;
  date_parse_result local_220;
  undefined1 local_104 [4];
  undefined1 local_100 [208];
  
  uVar8 = (ulong)*(ushort *)str;
  local_408 = daytime;
  local_3c8 = lc;
  local_3d8 = CVmDateLocale::get(lc,local_3b0,6);
  iVar2 = 0;
  memset(&local_370.pera,0,0xd0);
  local_370.era = 0;
  local_370.yy = -0x80000000;
  local_370.mm = -0x80000000;
  local_370.dd = -0x80000000;
  local_370.mi = -0x80000000;
  local_370.ss = -0x80000000;
  local_370.ms = -0x80000000;
  local_370.tzofs = -0x80000000;
  local_370.w = -0x80000000;
  local_370.yy_needs_century = 0;
  local_370.ampm = 0;
  local_370.hh = -0x80000000;
  local_370.tz = (CVmTimeZone *)0x0;
  local_3e0 = cal;
  local_370.cal = cal;
  if (uVar8 != 0) {
    memset(local_100,0,0xd0);
    local_3e8 = custom;
    format_iter::format_iter(&local_258,parse_date_string::fmt,0x37,custom);
    pcVar4 = format_iter::next(&local_258,(size_t *)&local_428);
    if (pcVar4 != (char *)0x0) {
      pcVar7 = str + 2;
      local_430 = 0;
      local_3f0 = dayno;
      do {
        local_3d0 = fmtlist + local_430;
        local_41c = -0x80000000;
        local_434 = 0;
        local_400 = local_3e0;
        local_418 = (CVmTimeZone *)0x0;
        local_420 = -0x80000000;
        local_3b0[5]._0_4_ = 0;
        local_3b0[5]._4_4_ = -0x80000000;
        local_3b0[6]._0_4_ = -0x80000000;
        local_3b0[6]._4_4_ = -0x80000000;
        local_3b0[3]._0_4_ = -0x80000000;
        local_3b0[3]._4_4_ = 0;
        local_3b0[4]._0_4_ = 0;
        local_3b0[4]._4_4_ = -0x80000000;
        local_3b0[1]._0_4_ = -0x80000000;
        local_3b0[1]._4_4_ = -0x80000000;
        local_3b0[2] = 0;
        do {
          pcVar1 = local_428;
          pcVar11 = pcVar4;
          local_3f8 = pcVar7;
          local_3b8 = uVar8;
          if (((char *)0x2 < local_428) && (*pcVar4 == '[')) {
            pcVar11 = pcVar4 + 1;
            pcVar9 = (char *)0x0;
            do {
              if (pcVar11[(long)pcVar9] == '\0') break;
              if (pcVar11[(long)pcVar9] == ']') {
                if (((char *)(long)(int)local_3b0[0] != pcVar9) ||
                   (iVar2 = memicmp(pcVar11,local_3d8,local_3b0[0]), iVar2 != 0)) goto LAB_00253a44;
                pcVar11 = pcVar11 + (long)pcVar9;
                goto LAB_00253912;
              }
              pcVar9 = pcVar9 + 1;
            } while (local_428 + -1 != pcVar9);
            pcVar11 = (char *)0x0;
LAB_00253912:
            local_428 = pcVar4 + (long)local_428 + ~(ulong)pcVar11;
            pcVar11 = pcVar11 + 1;
          }
          pcVar9 = local_428;
          local_3c0 = pcVar1;
          memcpy(&local_220,&local_370,0x118);
          iVar2 = parse_string_fmt(&local_220,&local_3f8,&local_3b8,pcVar11,(size_t)pcVar9,local_3c8
                                  );
          if (iVar2 != 0) {
            uVar10 = (int)local_3f8 - (int)pcVar7;
            if ((int)local_434 < (int)uVar10) {
              local_400 = local_220.cal;
              local_3b0[5]._0_4_ = local_220.era;
              local_3b0[5]._4_4_ = local_220.yy;
              local_3b0[6]._0_4_ = local_220.mm;
              local_3b0[6]._4_4_ = local_220.dd;
              local_3b0[3]._0_4_ = local_220.w;
              local_3b0[3]._4_4_ = local_220.yy_needs_century;
              local_3b0[4]._0_4_ = local_220.ampm;
              local_3b0[4]._4_4_ = local_220.hh;
              local_3b0[1]._0_4_ = local_220.mi;
              local_3b0[1]._4_4_ = local_220.ss;
              local_3b0[2] = 0;
              local_41c = local_220.ms;
              local_40c = local_220._52_4_;
              local_418 = local_220.tz;
              local_420 = local_220.tzofs;
              memcpy(local_104,&local_220.field_0x44,0xd4);
              local_434 = uVar10;
              if ((nfmtlist != (int *)0x0) && (local_430 < *nfmtlist)) {
                local_3d0->p = pcVar4;
                local_3d0->len = (size_t)local_3c0;
              }
            }
          }
LAB_00253a44:
          pcVar4 = format_iter::next(&local_258,(size_t *)&local_428);
          dayno = local_3f0;
        } while (pcVar4 != (char *)0x0);
        if (local_434 == 0) {
          return 0;
        }
        local_370.cal = local_400;
        local_370.era = (undefined4)local_3b0[5];
        local_370.yy = local_3b0[5]._4_4_;
        local_370.mm = (undefined4)local_3b0[6];
        local_370.dd = local_3b0[6]._4_4_;
        local_370.w = (undefined4)local_3b0[3];
        local_370.yy_needs_century = local_3b0[3]._4_4_;
        local_370.ampm = (undefined4)local_3b0[4];
        local_370.hh = local_3b0[4]._4_4_;
        local_370.mi = (undefined4)local_3b0[1];
        local_370.ss = local_3b0[1]._4_4_;
        local_370.ms = local_41c;
        local_370._52_4_ = local_40c;
        local_370.tz = local_418;
        local_370.tzofs = local_420;
        memcpy(&local_370.field_0x44,local_104,0xd4);
        custom_00 = local_3e8;
        uVar8 = uVar8 - local_434;
        if (uVar8 == 0) {
LAB_00253bb6:
          iVar2 = (int)local_430 + 1;
          if (local_418 == (CVmTimeZone *)0x0) goto LAB_00253bca;
          goto LAB_00253bda;
        }
        pcVar7 = pcVar7 + local_434;
        while (pvVar5 = memchr(" \t;,:",(int)*pcVar7,6), pvVar5 != (void *)0x0) {
          pcVar7 = pcVar7 + 1;
          uVar8 = uVar8 - 1;
          if (uVar8 == 0) goto LAB_00253bb6;
        }
        local_430 = local_430 + 1;
        memset(local_100,0,0xd0);
        format_iter::format_iter(&local_258,parse_date_string::fmt,0x37,custom_00);
        pcVar4 = format_iter::next(&local_258,(size_t *)&local_428);
      } while (pcVar4 != (char *)0x0);
    }
    return 0;
  }
LAB_00253bca:
  local_370.tz = reftz;
LAB_00253bda:
  date_parse_result::utc_to_local(&local_370,&refday,&reftime);
  date_parse_result::def_date(&local_370,refday);
  daytime_00 = local_408;
  __dest = resultp;
  if (local_370.ampm == 2) {
    if (0xb < local_370.hh) goto LAB_00253c4a;
    iVar6 = local_370.hh + 0xc;
  }
  else if ((local_370.ampm != 1) || (iVar6 = 0, local_370.hh != 0xc)) goto LAB_00253c4a;
  local_370.hh = iVar6;
LAB_00253c4a:
  iVar3 = date_parse_result::dayno(&local_370);
  *dayno = iVar3;
  *daytime_00 = local_370.ss * 1000 + local_370.mi * 60000 + local_370.hh * 3600000 + local_370.ms;
  caldate_t::normalize(dayno,daytime_00);
  date_parse_result::local_to_utc(&local_370,dayno,daytime_00);
  if (__dest != (date_parse_result *)0x0) {
    memcpy(__dest,&local_370,0x118);
  }
  if (nfmtlist != (int *)0x0) {
    *nfmtlist = iVar2;
  }
  return 1;
}

Assistant:

int CVmObjDate::parse_date_string(
    VMG_ int32_t &dayno, int32_t &daytime,
    const char *str, const vm_val_t *custom, CVmDateLocale *lc,
    multicaldate_t *cal, int32_t refday, int32_t reftime, CVmTimeZone *reftz,
    date_parse_result *resultp, date_parse_string *fmtlist, int *nfmtlist)
{
    /* get the string length and buffer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* format list */
    static const char *fmt[] =
    {
        /* US-style dates, with the month first */
        "[us]m / d / y",
        "[us]m / d",
        "[us]m - d",
        "[us]m . d",
        "[us]m .\t- d .\t- y",

        /* European-style date formats, with day/month order */
        "[eu]d / m / y",
        "[eu]d / m",
        "[eu]d - m",
        "[eu]d . m",
        "[eu]d .\t- m .\t- y",

        /* match some special computer formats first */
        "yyyy mm dd",                             /* 8-digit year month day */
        "yyyy .? doy",                   /* PostreSQL year with day-of-year */

        /* universal date formats */
        "m / y",
        "m - y",
        "month _.\t-* ddth _,.\t+ ye",
        "ddth _.\t-* month _,.\t-* ye",
        "month _.\t-* ddth",
        "ddth _.\t-* month",
        "month - dd - ye",
        "month _\t.-* y",
        "month",
        "+- y - mm - dd",
        "y / m / d",
        "y - m - d",
        "y / m",
        "y - m",
        "ye _\t.-* month _\t.-* d",
        "ye _\t.-* month",
        "ye - month - dd",
        "yyyy",
        "era _* y",
        "y _* era",

        /* time formats */
        "h _? ampm",
        "h : mi",
        "h .: mi _? ampm",
        "h .: mi .: ss _? ampm",
        "h : mi : ss",
        "h : mi : ss .: ssfrac _? ampm",
        "h : mi : ss .: ssfrac",
        "tT? hh .: mi",
        "tT? hh mi",
        "tT? hh .: mi .: ss",
        "tT? hh mi SS",
        "tT? hh .: mi .: ss _? tz",
        "tT? hh .: mi .: ss . ssfrac",
        "tz",

        /* special formats (ISO, other software, etc) */
        "d / mon / yyyy : hh : mi : ss _ gmtofs",         /* Unix log files */
        "yyyy : mm : dd _ hh : mi : ss",                            /* EXIF */
        "yyyy -? \\W W",                          /* ISO year with ISO week */
        "yyyy - mm - dd \\T hh : mi : ss . ssfrac",                 /* SOAP */
        "yyyy - mm - dd \\T hh : mi : ss . ssfrac gmtofs",          /* SOAP */
        "@ unix",                                         /* Unix timestamp */
        "yyyy mm dd \\T hh : mi : ss",                            /* XMLRPC */
        "yyyy mm dd \\t hh mi ss",                      /* XMLRPC - compact */
        "yyyy - m - d \\T h : i : s"                                /* WDDX */
    };

    /* get the template filter in "[xx]" format */
    size_t filterlen;
    const char *filter = lc->get(vmg_ filterlen, LC_PARSE_FILTER);
    
    /* keep separate results for each pass */
    date_parse_result result(cal);

    /*
     *   Run through the format list as many times as it takes to either
     *   consume the whole source string, or fail to find a matching format.
     *   We have multiple format parts that can be specified individually or
     *   in combination (time, date, time + date, date + time, etc).
     */
    int fcapi;
    for (fcapi = 0 ; len != 0 ; ++fcapi)
    {
        /* we haven't found a best result for this pass yet */
        int bestlen = 0;
        date_parse_result bestres(cal);
        
        /* search the list for a match */
        format_iter fi(vmg_ fmt, countof(fmt), custom);
        size_t curfmtl;
        const char *curfmt;
        while ((curfmt = fi.next(vmg_ curfmtl)) != 0)
        {
            /* set up at the current position */
            const char *curstr = str;
            size_t curlen = len;

            /* remember the original format string */
            const char *curfmt0 = curfmt;
            size_t curfmtl0 = curfmtl;

            /* if this is a "[us]" or "[eu]" local entry, filter it */
            if (curfmtl >= 3 && curfmt[0] == '[')
            {
                /* get the ']' */
                const char *rb = lib_strnchr(curfmt+1, curfmtl-1, ']');

                /* 
                 *   if we found it, and the contents of the brackets don't
                 *   match the locale filter string, filter out this format 
                 */
                if (rb != 0
                    && (rb - curfmt - 1 != (int)filterlen
                        || memicmp(curfmt + 1, filter, filterlen) != 0))
                    continue;

                /* skip the filter string */
                curfmtl -= rb - curfmt + 1;
                curfmt = rb + 1;
            }

            /* start with the results from previous passes */
            date_parse_result curres(result);

            /* try matching this format at the current position */
            if (parse_string_fmt(vmg_ &curres, curstr, curlen,
                                 curfmt, curfmtl, lc))
            {
                /* if this is the longest match of this pass, keep it */
                int reslen = curstr - str;
                if (reslen > bestlen)
                {
                    /* remember this as the best result so far */
                    bestlen = reslen;
                    bestres = curres;

                    /* remember the format string it matches, if desired */
                    if (nfmtlist != 0 && fcapi < *nfmtlist)
                        fmtlist[fcapi].set(curfmt0, curfmtl0);
                }
            }
        }

        /* if we didn't find a match on this round, we've failed */
        if (bestlen == 0)
            return FALSE;

        /* skip what we matched for the best result of this pass */
        str += bestlen;
        len -= bestlen;

        /* keep the best result for this pass */
        result = bestres;

        /* skip spaces and other separator characters */
        for ( ; len != 0 && strchr(" \t;,:", *str) != 0 ; ++str, --len) ;
    }

    /* default to the reference time zone */
    result.def_tz(reftz);

    /* adjust the reference time to the appropriate local time zone */
    result.utc_to_local(refday, reftime);

    /* set missing date elements to the corresponding reference date values */
    result.def_date(refday);
    
    /* set any missing time elements to midnight or zero past the hour/min */
    result.def_time(0, 0, 0, 0);

    /* convert to our internal day and time representation */
    dayno = result.dayno();
    daytime = result.daytime();
    caldate_t::normalize(dayno, daytime);

    /* translate the final time value from the specified local time to UTC */
    result.local_to_utc(dayno, daytime);

    /* copy back the results if the caller's interested */
    if (resultp != 0)
        memcpy(resultp, &result, sizeof(result));

    /* tell the caller how many format strings we matched, if desired */
    if (nfmtlist != 0)
        *nfmtlist = fcapi;

    /* success */
    return TRUE;
}